

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void deqp::gles3::Performance::anon_unknown_1::generateTwoPassRandomIterationOrder
               (vector<int,_std::allocator<int>_> *iterationOrder,int numSamples)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  int min;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  int local_48;
  int ndx_1;
  int local_34;
  int local_30;
  int ndx;
  int sampleNdx_1;
  int sampleNdx;
  int midPoint;
  Random rnd;
  int numSamples_local;
  vector<int,_std::allocator<int>_> *iterationOrder_local;
  
  rnd.m_rnd.z = numSamples;
  unique0x10000172 = iterationOrder;
  de::Random::Random((Random *)&sampleNdx,0xabc);
  min = (int)(rnd.m_rnd.z + 1) / 2;
  for (ndx = 0; local_30 = min, ndx < min; ndx = ndx + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](stack0xfffffffffffffff0,(long)ndx);
    *pvVar3 = ndx << 1;
  }
  for (; local_30 < (int)rnd.m_rnd.z; local_30 = local_30 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (stack0xfffffffffffffff0,(long)local_30);
    *pvVar3 = (local_30 - min) * 2 + 1;
  }
  for (local_34 = 0; local_48 = min, local_34 < min; local_34 = local_34 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (stack0xfffffffffffffff0,(long)local_34);
    pvVar1 = stack0xfffffffffffffff0;
    iVar2 = de::Random::getInt((Random *)&sampleNdx,0,min + -1);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(long)iVar2);
    std::swap<int>(pvVar3,pvVar4);
  }
  for (; sVar5 = std::vector<int,_std::allocator<int>_>::size(stack0xfffffffffffffff0),
      local_48 < (int)sVar5; local_48 = local_48 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (stack0xfffffffffffffff0,(long)local_48);
    pvVar1 = stack0xfffffffffffffff0;
    sVar5 = std::vector<int,_std::allocator<int>_>::size(stack0xfffffffffffffff0);
    iVar2 = de::Random::getInt((Random *)&sampleNdx,min,(int)sVar5 + -1);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(long)iVar2);
    std::swap<int>(pvVar3,pvVar4);
  }
  de::Random::~Random((Random *)&sampleNdx);
  return;
}

Assistant:

static void generateTwoPassRandomIterationOrder (std::vector<int>& iterationOrder, int numSamples)
{
	de::Random	rnd			(0xabc);
	const int	midPoint	= (numSamples+1) / 2;		// !< ceil(m_numSamples / 2)

	DE_ASSERT((int)iterationOrder.size() == numSamples);

	// Two "passes" over range, randomize order in both passes
	// This allows to us detect if iterations are not independent
	// (first run and later run samples differ significantly?)

	for (int sampleNdx = 0; sampleNdx < midPoint; ++sampleNdx)
		iterationOrder[sampleNdx] = sampleNdx * 2;
	for (int sampleNdx = midPoint; sampleNdx < numSamples; ++sampleNdx)
		iterationOrder[sampleNdx] = (sampleNdx - midPoint) * 2 + 1;

	for (int ndx = 0; ndx < midPoint; ++ndx)
		std::swap(iterationOrder[ndx], iterationOrder[rnd.getInt(0, midPoint - 1)]);
	for (int ndx = midPoint; ndx < (int)iterationOrder.size(); ++ndx)
		std::swap(iterationOrder[ndx], iterationOrder[rnd.getInt(midPoint, (int)iterationOrder.size()-1)]);
}